

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

void __thiscall YAML::Emitter::PrepareIntegralStream(Emitter *this,stringstream *stream)

{
  Setting<YAML::EMITTER_MANIP> SVar1;
  uint uVar2;
  
  SVar1.m_value =
       (((this->m_pState)._M_t.
         super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
         super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
         super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl)->m_intFmt).m_value;
  if (SVar1.m_value == Oct) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(stream + 0x10),"0",1);
    uVar2 = 0x40;
  }
  else if (SVar1.m_value == Hex) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(stream + 0x10),"0x",2);
    uVar2 = 8;
  }
  else {
    if (SVar1.m_value != Dec) {
      return;
    }
    uVar2 = 2;
  }
  *(uint *)(stream + *(long *)(*(long *)(stream + 0x10) + -0x18) + 0x28) =
       *(uint *)(stream + *(long *)(*(long *)(stream + 0x10) + -0x18) + 0x28) & 0xffffffb5 | uVar2;
  return;
}

Assistant:

void Emitter::PrepareIntegralStream(std::stringstream& stream) const {

  switch (m_pState->GetIntFormat()) {
    case Dec:
      stream << std::dec;
      break;
    case Hex:
      stream << "0x";
      stream << std::hex;
      break;
    case Oct:
      stream << "0";
      stream << std::oct;
      break;
    default:
      assert(false);
  }
}